

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall duckdb::Function::~Function(Function *this)

{
  ~Function(this);
  operator_delete(this);
  return;
}

Assistant:

Function::~Function() {
}